

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_model_animation_array
rf_load_model_animations_from_iqm
          (uchar *data,int data_size,rf_allocator allocator,rf_allocator temp_allocator)

{
  rf_model_animation *prVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  float fVar15;
  long lVar16;
  size_t __n;
  rf_source_location rVar17;
  rf_source_location rVar18;
  rf_source_location rVar19;
  rf_source_location rVar20;
  rf_source_location rVar21;
  rf_source_location rVar22;
  rf_source_location rVar23;
  rf_source_location rVar24;
  rf_source_location rVar25;
  rf_source_location rVar26;
  rf_allocator_args rVar27;
  rf_allocator_args rVar28;
  rf_allocator_args rVar29;
  undefined1 auVar30 [24];
  undefined1 auVar31 [24];
  undefined1 auVar32 [24];
  undefined1 auVar33 [24];
  undefined1 auVar34 [24];
  undefined1 auVar35 [24];
  undefined1 auVar36 [24];
  ulong uVar37;
  int *__dest;
  void *__dest_00;
  void *__dest_01;
  long lVar38;
  rf_bone_info *prVar39;
  rf_transform **pprVar40;
  int *piVar41;
  ulong uVar42;
  rf_transform *prVar43;
  long lVar44;
  ulong uVar45;
  rf_model_animation *prVar46;
  rf_int j;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  long lVar50;
  rf_int i;
  float *pfVar51;
  long lVar52;
  undefined8 uVar53;
  long in_FS_OFFSET;
  undefined1 auVar54 [16];
  rf_vec3 rVar55;
  rf_quaternion rVar56;
  rf_model_animation_array rVar57;
  rf_quaternion q2;
  rf_quaternion q_00;
  rf_allocator allocator_local;
  rf_allocator temp_allocator_local;
  uint uStack_2c4;
  uint uStack_294;
  uint uStack_264;
  uint uStack_234;
  uint uStack_204;
  uint uStack_1d4;
  uint uStack_1a4;
  uint uStack_174;
  uint uStack_144;
  uint uStack_114;
  rf_iqm_header iqm;
  rf_quaternion q;
  
  temp_allocator_local.user_data = temp_allocator.user_data;
  allocator_local.allocator_proc = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  uVar47 = 0;
  prVar46 = (rf_model_animation *)0x0;
  if (data_size != 0 && data != (uchar *)0x0) {
    temp_allocator_local.allocator_proc = temp_allocator.allocator_proc;
    memcpy(&iqm,data,0x7c);
    auVar54[0] = -(iqm.magic[0] == 'I');
    auVar54[1] = -(iqm.magic[1] == 'N');
    auVar54[2] = -(iqm.magic[2] == 'T');
    auVar54[3] = -(iqm.magic[3] == 'E');
    auVar54[4] = -(iqm.magic[4] == 'R');
    auVar54[5] = -(iqm.magic[5] == 'Q');
    auVar54[6] = -(iqm.magic[6] == 'U');
    auVar54[7] = -(iqm.magic[7] == 'A');
    auVar54[8] = -(iqm.magic[8] == 'K');
    auVar54[9] = -(iqm.magic[9] == 'E');
    auVar54[10] = -(iqm.magic[10] == 'M');
    auVar54[0xb] = -(iqm.magic[0xb] == 'O');
    auVar54[0xc] = -(iqm.magic[0xc] == 'D');
    auVar54[0xd] = -(iqm.magic[0xd] == 'E');
    auVar54[0xe] = -(iqm.magic[0xe] == 'L');
    auVar54[0xf] = -(iqm.magic[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) | (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe | (ushort)(auVar54[0xf] >> 7) << 0xf
                ) == 0xffff) {
      if (iqm.version == 2) {
        uVar37 = (ulong)iqm.num_poses;
        rVar17.proc_name = "rf_load_model_animations_from_iqm";
        rVar17.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar17.line_in_file = 0x8670;
        auVar30._8_8_ = (ulong)uStack_114 << 0x20;
        auVar30._0_8_ = uVar37 * 0x58;
        auVar30._16_8_ = 0;
        __dest = (int *)(*temp_allocator.allocator_proc)
                                  (&temp_allocator_local,rVar17,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar30 << 0x40));
        memcpy(__dest,data + iqm.ofs_poses,uVar37 * 0x58);
        uVar47 = (ulong)iqm.num_anims;
        rVar18.proc_name = "rf_load_model_animations_from_iqm";
        rVar18.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar18.line_in_file = 0x8674;
        auVar31._8_8_ = (ulong)uStack_144 << 0x20;
        auVar31._0_8_ = uVar47 * 0x14;
        auVar31._16_8_ = 0;
        __dest_00 = (*temp_allocator_local.allocator_proc)
                              (&temp_allocator_local,rVar18,RF_AM_ALLOC,
                               (rf_allocator_args)(auVar31 << 0x40));
        memcpy(__dest_00,data + iqm.ofs_anims,uVar47 * 0x14);
        rVar19.proc_name = "rf_load_model_animations_from_iqm";
        rVar19.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar19.line_in_file = 0x8677;
        auVar32._8_8_ = (ulong)uStack_174 << 0x20;
        auVar32._0_8_ = uVar47 << 5;
        auVar32._16_8_ = 0;
        prVar46 = (rf_model_animation *)
                  (*allocator_local.allocator_proc)
                            (&allocator_local,rVar19,RF_AM_ALLOC,
                             (rf_allocator_args)(auVar32 << 0x40));
        __n = (ulong)(iqm.num_frames * iqm.num_framechannels) * 2;
        rVar20.proc_name = "rf_load_model_animations_from_iqm";
        rVar20.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar20.line_in_file = 0x867d;
        auVar33._8_8_ = (ulong)uStack_1a4 << 0x20;
        auVar33._0_8_ = __n;
        auVar33._16_8_ = 0;
        __dest_01 = (*temp_allocator_local.allocator_proc)
                              (&temp_allocator_local,rVar20,RF_AM_ALLOC,
                               (rf_allocator_args)(auVar33 << 0x40));
        memcpy(__dest_01,data + iqm.ofs_frames,__n);
        lVar38 = uVar37 * 0x28;
        for (uVar45 = 0; uVar45 != uVar47; uVar45 = uVar45 + 1) {
          lVar50 = uVar45 * 0x14;
          prVar1 = prVar46 + uVar45;
          prVar46[uVar45].frame_count = (ulong)*(uint *)((long)__dest_00 + lVar50 + 8);
          prVar46[uVar45].bone_count = uVar37;
          rVar21.proc_name = "rf_load_model_animations_from_iqm";
          rVar21.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar21.line_in_file = 0x8684;
          auVar34._8_8_ = (ulong)uStack_1d4 << 0x20;
          auVar34._0_8_ = lVar38;
          auVar34._16_8_ = 0;
          prVar39 = (rf_bone_info *)
                    (*allocator_local.allocator_proc)
                              (&allocator_local,rVar21,RF_AM_ALLOC,
                               (rf_allocator_args)(auVar34 << 0x40));
          prVar46[uVar45].bones = prVar39;
          rVar22.proc_name = "rf_load_model_animations_from_iqm";
          rVar22.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar22.line_in_file = 0x8685;
          auVar35._8_8_ = (ulong)uStack_204 << 0x20;
          auVar35._0_8_ = (ulong)*(uint *)((long)__dest_00 + lVar50 + 8) << 3;
          auVar35._16_8_ = 0;
          pprVar40 = (rf_transform **)
                     (*allocator_local.allocator_proc)
                               (&allocator_local,rVar22,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar35 << 0x40));
          prVar46[uVar45].frame_poses = pprVar40;
          piVar41 = __dest;
          for (lVar44 = 0; lVar38 != lVar44; lVar44 = lVar44 + 0x28) {
            builtin_strncpy(prVar1->bones->name + lVar44,"ANIMJOINTNAME",0xe);
            *(long *)(prVar1->bones->name + lVar44 + 0x20) = (long)*piVar41;
            piVar41 = piVar41 + 0x16;
          }
          for (uVar48 = 0; uVar42 = (ulong)*(uint *)((long)__dest_00 + lVar50 + 8), uVar48 < uVar42;
              uVar48 = uVar48 + 1) {
            rVar23.proc_name = "rf_load_model_animations_from_iqm";
            rVar23.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar23.line_in_file = 0x8690;
            auVar36._8_8_ = (ulong)uStack_234 << 0x20;
            auVar36._0_8_ = lVar38;
            auVar36._16_8_ = 0;
            prVar43 = (rf_transform *)
                      (*allocator_local.allocator_proc)
                                (&allocator_local,rVar23,RF_AM_ALLOC,
                                 (rf_allocator_args)(auVar36 << 0x40));
            prVar1->frame_poses[uVar48] = prVar43;
          }
          iVar49 = *(int *)((long)__dest_00 + lVar50 + 4) * iqm.num_framechannels;
          for (uVar48 = 0; uVar48 < uVar42; uVar48 = uVar48 + 1) {
            pfVar51 = (float *)(__dest + 0x15);
            for (lVar44 = 0; lVar38 != lVar44; lVar44 = lVar44 + 0x28) {
              fVar2 = pfVar51[-0x13];
              prVar43 = prVar1->frame_poses[uVar48];
              *(float *)((long)&(prVar43->translation).x + lVar44) = fVar2;
              fVar15 = pfVar51[-0x14];
              if (((uint)fVar15 & 1) != 0) {
                *(float *)((long)&(prVar43->translation).x + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-9] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-0x12];
              *(float *)((long)&(prVar43->translation).y + lVar44) = fVar2;
              if (((uint)fVar15 & 2) != 0) {
                *(float *)((long)&(prVar43->translation).y + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-8] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-0x11];
              *(float *)((long)&(prVar43->translation).z + lVar44) = fVar2;
              if (((uint)fVar15 & 4) != 0) {
                *(float *)((long)&(prVar43->translation).z + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-7] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-0x10];
              *(float *)((long)&(prVar43->rotation).x + lVar44) = fVar2;
              if (((uint)fVar15 & 8) != 0) {
                *(float *)((long)&(prVar43->rotation).x + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-6] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-0xf];
              *(float *)((long)&(prVar43->rotation).y + lVar44) = fVar2;
              if (((uint)fVar15 & 0x10) != 0) {
                *(float *)((long)&(prVar43->rotation).y + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-5] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-0xe];
              *(float *)((long)&(prVar43->rotation).z + lVar44) = fVar2;
              if (((uint)fVar15 & 0x20) != 0) {
                *(float *)((long)&(prVar43->rotation).z + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-4] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-0xd];
              *(float *)((long)&(prVar43->rotation).w + lVar44) = fVar2;
              if (((uint)fVar15 & 0x40) != 0) {
                *(float *)((long)&(prVar43->rotation).w + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-3] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-0xc];
              *(float *)((long)&(prVar43->scale).x + lVar44) = fVar2;
              if (SUB41(fVar15,0) < '\0') {
                *(float *)((long)&(prVar43->scale).x + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-2] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-0xb];
              *(float *)((long)&(prVar43->scale).y + lVar44) = fVar2;
              if (((uint)fVar15 >> 8 & 1) != 0) {
                *(float *)((long)&(prVar43->scale).y + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * pfVar51[-1] + fVar2;
                iVar49 = iVar49 + 1;
              }
              fVar2 = pfVar51[-10];
              *(float *)((long)&(prVar43->scale).z + lVar44) = fVar2;
              if (((uint)fVar15 >> 9 & 1) != 0) {
                *(float *)((long)&(prVar43->scale).z + lVar44) =
                     (float)*(ushort *)((long)__dest_01 + (long)iVar49 * 2) * *pfVar51 + fVar2;
                iVar49 = iVar49 + 1;
              }
              q._8_8_ = *(undefined8 *)((long)&(prVar43->rotation).z + lVar44);
              q._0_8_ = *(undefined8 *)((long)&(prVar43->rotation).x + lVar44);
              rVar56 = rf_quaternion_normalize(q);
              *(rf_quaternion *)((long)&(prVar43->rotation).x + lVar44) = rVar56;
              pfVar51 = pfVar51 + 0x16;
            }
            uVar42 = (ulong)*(uint *)((long)__dest_00 + lVar50 + 8);
          }
          for (uVar48 = 0; uVar48 < uVar42; uVar48 = uVar48 + 1) {
            lVar44 = 0;
            for (lVar52 = 0; lVar52 < prVar1->bone_count; lVar52 = lVar52 + 1) {
              lVar16 = *(long *)(prVar1->bones->name + lVar44 + 0x20);
              if (-1 < lVar16) {
                prVar43 = prVar1->frame_poses[uVar48];
                uVar3 = prVar43[lVar16].rotation.x;
                uVar9 = prVar43[lVar16].rotation.y;
                rVar56.y = (float)uVar9;
                rVar56.x = (float)uVar3;
                uVar4 = prVar43[lVar16].rotation.z;
                uVar10 = prVar43[lVar16].rotation.w;
                rVar56.w = (float)uVar10;
                rVar56.z = (float)uVar4;
                q2._8_8_ = *(undefined8 *)((long)&(prVar43->rotation).z + lVar44);
                q2._0_8_ = *(undefined8 *)((long)&(prVar43->rotation).x + lVar44);
                rVar56 = rf_quaternion_mul(rVar56,q2);
                *(rf_quaternion *)((long)&(prVar43->rotation).x + lVar44) = rVar56;
                prVar43 = prVar1->frame_poses[uVar48];
                lVar16 = *(long *)(prVar1->bones->name + lVar44 + 0x20);
                uVar5 = prVar43[lVar16].rotation.x;
                uVar11 = prVar43[lVar16].rotation.y;
                q_00.y = (float)uVar11;
                q_00.x = (float)uVar5;
                uVar6 = prVar43[lVar16].rotation.z;
                uVar12 = prVar43[lVar16].rotation.w;
                q_00.w = (float)uVar12;
                q_00.z = (float)uVar6;
                rVar55.z = *(float *)((long)&(prVar43->translation).z + lVar44);
                rVar55._0_8_ = *(undefined8 *)((long)&(prVar43->translation).x + lVar44);
                rVar55 = rf_vec3_rotate_by_quaternion(rVar55,q_00);
                *(long *)((long)&(prVar43->translation).x + lVar44) = rVar55._0_8_;
                *(float *)((long)&(prVar43->translation).z + lVar44) = rVar55.z;
                prVar43 = prVar1->frame_poses[uVar48];
                lVar16 = *(long *)(prVar1->bones->name + lVar44 + 0x20);
                uVar53 = *(undefined8 *)((long)&(prVar43->translation).x + lVar44);
                uVar7 = prVar43[lVar16].translation.x;
                uVar13 = prVar43[lVar16].translation.y;
                fVar2 = prVar43[lVar16].translation.z;
                *(ulong *)((long)&(prVar43->translation).x + lVar44) =
                     CONCAT44((float)uVar13 + (float)((ulong)uVar53 >> 0x20),
                              (float)uVar7 + (float)uVar53);
                *(float *)((long)&(prVar43->translation).z + lVar44) =
                     *(float *)((long)&(prVar43->translation).z + lVar44) + fVar2;
                prVar43 = prVar1->frame_poses[uVar48];
                lVar16 = *(long *)(prVar1->bones->name + lVar44 + 0x20);
                uVar53 = *(undefined8 *)((long)&(prVar43->scale).x + lVar44);
                uVar8 = prVar43[lVar16].scale.x;
                uVar14 = prVar43[lVar16].scale.y;
                fVar2 = prVar43[lVar16].scale.z;
                *(ulong *)((long)&(prVar43->scale).x + lVar44) =
                     CONCAT44((float)uVar14 * (float)((ulong)uVar53 >> 0x20),
                              (float)uVar8 * (float)uVar53);
                *(float *)((long)&(prVar43->scale).z + lVar44) =
                     *(float *)((long)&(prVar43->scale).z + lVar44) * fVar2;
              }
              lVar44 = lVar44 + 0x28;
            }
            uVar42 = (ulong)*(uint *)((long)__dest_00 + lVar50 + 8);
          }
        }
        rVar24.proc_name = "rf_load_model_animations_from_iqm";
        rVar24.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar24.line_in_file = 0x86fd;
        rVar27.size_to_allocate_or_reallocate = 0;
        rVar27.pointer_to_free_or_realloc = __dest_01;
        rVar27._16_8_ = (ulong)uStack_264 << 0x20;
        (*temp_allocator_local.allocator_proc)(&temp_allocator_local,rVar24,RF_AM_FREE,rVar27);
        rVar25.proc_name = "rf_load_model_animations_from_iqm";
        rVar25.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar25.line_in_file = 0x86fe;
        rVar28.size_to_allocate_or_reallocate = 0;
        rVar28.pointer_to_free_or_realloc = __dest;
        rVar28._16_8_ = (ulong)uStack_294 << 0x20;
        (*temp_allocator_local.allocator_proc)(&temp_allocator_local,rVar25,RF_AM_FREE,rVar28);
        rVar26.proc_name = "rf_load_model_animations_from_iqm";
        rVar26.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar26.line_in_file = 0x86ff;
        rVar29.size_to_allocate_or_reallocate = 0;
        rVar29.pointer_to_free_or_realloc = __dest_00;
        rVar29._16_8_ = (ulong)uStack_2c4 << 0x20;
        (*temp_allocator_local.allocator_proc)(&temp_allocator_local,rVar26,RF_AM_FREE,rVar29);
        goto LAB_0013f8c6;
      }
      uVar53 = 0x8666;
      rf_log_impl(8,0x173bf4,(char *)0x5);
    }
    else {
      uVar53 = 0x865f;
      rf_log_impl(8,0x173bd3,(char *)0x5);
    }
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    uVar47 = 0;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_model_animations_from_iqm";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = uVar53;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 5;
    prVar46 = (rf_model_animation *)0x0;
  }
LAB_0013f8c6:
  rVar57.anims = prVar46;
  rVar57.size = uVar47;
  return rVar57;
}

Assistant:

RF_API rf_model_animation_array rf_load_model_animations_from_iqm(const unsigned char* data, int data_size, rf_allocator allocator, rf_allocator temp_allocator)
{
    if (!data || !data_size) return (rf_model_animation_array) {0};

    #define RF_IQM_MAGIC "INTERQUAKEMODEL" // IQM file magic number
    #define RF_IQM_VERSION 2 // only IQM version 2 supported

    typedef struct rf_iqm_header rf_iqm_header;
    struct rf_iqm_header
    {
        char magic[16];
        unsigned int version;
        unsigned int filesize;
        unsigned int flags;
        unsigned int num_text, ofs_text;
        unsigned int num_meshes, ofs_meshes;
        unsigned int num_vertexarrays, num_vertexes, ofs_vertexarrays;
        unsigned int num_triangles, ofs_triangles, ofs_adjacency;
        unsigned int num_joints, ofs_joints;
        unsigned int num_poses, ofs_poses;
        unsigned int num_anims, ofs_anims;
        unsigned int num_frames, num_framechannels, ofs_frames, ofs_bounds;
        unsigned int num_comment, ofs_comment;
        unsigned int num_extensions, ofs_extensions;
    };

    typedef struct rf_iqm_pose rf_iqm_pose;
    struct rf_iqm_pose
    {
        int parent;
        unsigned int mask;
        float channeloffset[10];
        float channelscale[10];
    };

    typedef struct rf_iqm_anim rf_iqm_anim;
    struct rf_iqm_anim
    {
        unsigned int name;
        unsigned int first_frame, num_frames;
        float framerate;
        unsigned int flags;
    };

    rf_iqm_header iqm;

    // Read IQM header
    memcpy(&iqm, data, sizeof(rf_iqm_header));

    if (strncmp(iqm.magic, RF_IQM_MAGIC, sizeof(RF_IQM_MAGIC)))
    {
        char temp_str[sizeof(RF_IQM_MAGIC) + 1] = {0};
        memcpy(temp_str, iqm.magic, sizeof(RF_IQM_MAGIC));
        RF_LOG_ERROR(RF_BAD_FORMAT, "Magic Number \"%s\"does not match.", temp_str);

        return (rf_model_animation_array){0};
    }

    if (iqm.version != RF_IQM_VERSION)
    {
        RF_LOG_ERROR(RF_BAD_FORMAT, "IQM version %i is incorrect.", iqm.version);

        return (rf_model_animation_array){0};
    }

    rf_model_animation_array result = {
        .size = iqm.num_anims,
    };

    // Get bones data
    rf_iqm_pose* poses = (rf_iqm_pose*) RF_ALLOC(temp_allocator, iqm.num_poses * sizeof(rf_iqm_pose));
    memcpy(poses, data + iqm.ofs_poses, iqm.num_poses * sizeof(rf_iqm_pose));

    // Get animations data
    rf_iqm_anim* anim = (rf_iqm_anim*) RF_ALLOC(temp_allocator, iqm.num_anims * sizeof(rf_iqm_anim));
    memcpy(anim, data + iqm.ofs_anims, iqm.num_anims * sizeof(rf_iqm_anim));

    rf_model_animation* animations = (rf_model_animation*) RF_ALLOC(allocator, iqm.num_anims * sizeof(rf_model_animation));

    result.anims       = animations;
    result.size = iqm.num_anims;

    // frameposes
    unsigned short* framedata = (unsigned short*) RF_ALLOC(temp_allocator, iqm.num_frames * iqm.num_framechannels * sizeof(unsigned short));
    memcpy(framedata, data + iqm.ofs_frames, iqm.num_frames*iqm.num_framechannels * sizeof(unsigned short));

    for (rf_int a = 0; a < iqm.num_anims; a++)
    {
        animations[a].frame_count = anim[a].num_frames;
        animations[a].bone_count  = iqm.num_poses;
        animations[a].bones       = (rf_bone_info*) RF_ALLOC(allocator, iqm.num_poses * sizeof(rf_bone_info));
        animations[a].frame_poses = (rf_transform**) RF_ALLOC(allocator, anim[a].num_frames * sizeof(rf_transform*));
        //animations[a].framerate = anim.framerate;     // TODO: Use framerate?

        for (rf_int j = 0; j < iqm.num_poses; j++)
        {
            strcpy(animations[a].bones[j].name, "ANIMJOINTNAME");
            animations[a].bones[j].parent = poses[j].parent;
        }

        for (rf_int j = 0; j < anim[a].num_frames; j++)
        {
            animations[a].frame_poses[j] = (rf_transform*) RF_ALLOC(allocator, iqm.num_poses * sizeof(rf_transform));
        }

        int dcounter = anim[a].first_frame*iqm.num_framechannels;

        for (rf_int frame = 0; frame < anim[a].num_frames; frame++)
        {
            for (rf_int i = 0; i < iqm.num_poses; i++)
            {
                animations[a].frame_poses[frame][i].translation.x = poses[i].channeloffset[0];

                if (poses[i].mask & 0x01)
                {
                    animations[a].frame_poses[frame][i].translation.x += framedata[dcounter]*poses[i].channelscale[0];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].translation.y = poses[i].channeloffset[1];

                if (poses[i].mask & 0x02)
                {
                    animations[a].frame_poses[frame][i].translation.y += framedata[dcounter]*poses[i].channelscale[1];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].translation.z = poses[i].channeloffset[2];

                if (poses[i].mask & 0x04)
                {
                    animations[a].frame_poses[frame][i].translation.z += framedata[dcounter]*poses[i].channelscale[2];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.x = poses[i].channeloffset[3];

                if (poses[i].mask & 0x08)
                {
                    animations[a].frame_poses[frame][i].rotation.x += framedata[dcounter]*poses[i].channelscale[3];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.y = poses[i].channeloffset[4];

                if (poses[i].mask & 0x10)
                {
                    animations[a].frame_poses[frame][i].rotation.y += framedata[dcounter]*poses[i].channelscale[4];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.z = poses[i].channeloffset[5];

                if (poses[i].mask & 0x20)
                {
                    animations[a].frame_poses[frame][i].rotation.z += framedata[dcounter]*poses[i].channelscale[5];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation.w = poses[i].channeloffset[6];

                if (poses[i].mask & 0x40)
                {
                    animations[a].frame_poses[frame][i].rotation.w += framedata[dcounter]*poses[i].channelscale[6];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.x = poses[i].channeloffset[7];

                if (poses[i].mask & 0x80)
                {
                    animations[a].frame_poses[frame][i].scale.x += framedata[dcounter]*poses[i].channelscale[7];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.y = poses[i].channeloffset[8];

                if (poses[i].mask & 0x100)
                {
                    animations[a].frame_poses[frame][i].scale.y += framedata[dcounter]*poses[i].channelscale[8];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].scale.z = poses[i].channeloffset[9];

                if (poses[i].mask & 0x200)
                {
                    animations[a].frame_poses[frame][i].scale.z += framedata[dcounter]*poses[i].channelscale[9];
                    dcounter++;
                }

                animations[a].frame_poses[frame][i].rotation = rf_quaternion_normalize(animations[a].frame_poses[frame][i].rotation);
            }
        }

        // Build frameposes
        for (rf_int frame = 0; frame < anim[a].num_frames; frame++)
        {
            for (rf_int i = 0; i < animations[a].bone_count; i++)
            {
                if (animations[a].bones[i].parent >= 0)
                {
                    animations[a].frame_poses[frame][i].rotation    = rf_quaternion_mul(animations[a].frame_poses[frame][animations[a].bones[i].parent].rotation, animations[a].frame_poses[frame][i].rotation);
                    animations[a].frame_poses[frame][i].translation = rf_vec3_rotate_by_quaternion(animations[a].frame_poses[frame][i].translation, animations[a].frame_poses[frame][animations[a].bones[i].parent].rotation);
                    animations[a].frame_poses[frame][i].translation = rf_vec3_add(animations[a].frame_poses[frame][i].translation, animations[a].frame_poses[frame][animations[a].bones[i].parent].translation);
                    animations[a].frame_poses[frame][i].scale       = rf_vec3_mul_v(animations[a].frame_poses[frame][i].scale, animations[a].frame_poses[frame][animations[a].bones[i].parent].scale);
                }
            }
        }
    }

    RF_FREE(temp_allocator, framedata);
    RF_FREE(temp_allocator, poses);
    RF_FREE(temp_allocator, anim);

    return result;
}